

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ScatterAlongAxisLayerParams::SharedCtor(ScatterAlongAxisLayerParams *this)

{
  this->axis_ = 0;
  this->mode_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ScatterAlongAxisLayerParams::SharedCtor() {
  ::memset(&axis_, 0, reinterpret_cast<char*>(&mode_) -
    reinterpret_cast<char*>(&axis_) + sizeof(mode_));
  _cached_size_ = 0;
}